

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O2

uint lodepng::parseICC(LodePNGICC *icc,uchar *data,size_t size)

{
  size_t sVar1;
  ushort uVar2;
  uint uVar3;
  float *pfVar4;
  int iVar5;
  ulong uVar6;
  size_t pos;
  ulong uVar7;
  ulong uVar8;
  ulong pos_00;
  long lVar9;
  LodePNGICCCurve *pLVar10;
  float fVar11;
  ulong local_68;
  size_t local_60;
  LodePNGICCCurve *local_58;
  LodePNGICCCurve *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  if (size < 0x84) {
    return 1;
  }
  icc->has_chad = 0;
  icc->trc[2].type = 0;
  icc->trc[1].type = 0;
  icc->has_whitepoint = 0;
  icc->white[0] = 0.0;
  icc->white[1] = 0.0;
  icc->white[2] = 0.0;
  icc->has_chromaticity = 0;
  icc->red[0] = 0.0;
  icc->red[1] = 0.0;
  icc->red[2] = 0.0;
  icc->green[0] = 0.0;
  icc->green[1] = 0.0;
  *(undefined8 *)(icc->green + 2) = 0;
  icc->blue[1] = 0.0;
  icc->blue[2] = 0.0;
  icc->has_trc = 0;
  icc->trc[0].type = 0;
  local_60 = 8;
  uVar3 = decodeICCUint32(data,size,&local_60);
  if (size <= local_60) {
    return 1;
  }
  icc->version_major = uVar3 >> 0x18;
  icc->version_minor = uVar3 >> 0x14 & 0xf;
  icc->version_bugfix = uVar3 >> 0x10 & 0xf;
  local_60 = 0x10;
  uVar3 = decodeICCUint32(data,size,&local_60);
  if (size <= local_60) {
    return 1;
  }
  iVar5 = (uint)(uVar3 == 0x52474220) * 2;
  if (uVar3 == 0x47524159) {
    iVar5 = 1;
  }
  icc->inputspace = iVar5;
  local_60 = 0x44;
  fVar11 = decodeICC15Fixed16(data,size,&local_60);
  icc->illuminant[0] = fVar11;
  fVar11 = decodeICC15Fixed16(data,size,&local_60);
  icc->illuminant[1] = fVar11;
  fVar11 = decodeICC15Fixed16(data,size,&local_60);
  icc->illuminant[2] = fVar11;
  local_60 = 0x80;
  uVar3 = decodeICCUint32(data,size,&local_60);
  if (size <= local_60) {
    return 1;
  }
  local_50 = icc->trc;
  local_40 = (ulong)uVar3;
  local_38 = 0;
  pos = local_60;
  do {
    if (local_38 == local_40) {
      return 0;
    }
    local_60 = pos + 4;
    uVar3 = decodeICCUint32(data,size,&local_60);
    pos_00 = (ulong)uVar3;
    local_68 = pos_00;
    uVar3 = decodeICCUint32(data,size,&local_60);
    sVar1 = local_60;
    if (size <= local_60) {
      return 1;
    }
    if (uVar3 < 8) {
      return 1;
    }
    if (size <= pos_00) {
      return 1;
    }
    if (size < uVar3 + pos_00) {
      return 1;
    }
    uVar3 = isICCword(data,size,pos,"wtpt");
    if (uVar3 == 0) {
      uVar3 = isICCword(data,size,pos,"rXYZ");
      if (uVar3 == 0) {
        uVar3 = isICCword(data,size,pos,"gXYZ");
        if (uVar3 == 0) {
          uVar3 = isICCword(data,size,pos,"bXYZ");
          if (uVar3 == 0) {
            uVar3 = isICCword(data,size,pos,"chad");
            if (uVar3 == 0) {
              uVar3 = isICCword(data,size,pos,"rTRC");
              if ((((uVar3 != 0) || (uVar3 = isICCword(data,size,pos,"gTRC"), uVar3 != 0)) ||
                  (uVar3 = isICCword(data,size,pos,"bTRC"), uVar3 != 0)) ||
                 (uVar3 = isICCword(data,size,pos,"kTRC"), uVar3 != 0)) {
                uVar8 = (ulong)(data[pos] == 'g');
                if (data[pos] == 'b') {
                  uVar8 = 2;
                }
                uVar3 = isICCword(data,size,pos_00,"curv");
                if (uVar3 != 0) {
                  local_58 = local_50 + uVar8;
                  icc->has_trc = 1;
                  local_68 = pos_00 + 8;
                  uVar3 = decodeICCUint32(data,size,&local_68);
                  pos_00 = local_68;
                  if (uVar3 == 1) {
                    local_58->type = 2;
                    pos_00 = local_68 + 2;
                    fVar11 = 0.0;
                    if (pos_00 <= size) {
                      fVar11 = (float)(ushort)(*(ushort *)(data + local_68) << 8 |
                                              *(ushort *)(data + local_68) >> 8) * 0.00390625;
                    }
                    local_58->gamma = fVar11;
                    local_68 = pos_00;
                  }
                  else if (uVar3 == 0) {
                    local_58->type = 0;
                  }
                  else {
                    uVar7 = (ulong)uVar3;
                    local_58->type = 1;
                    if (0x1000000 < uVar3) {
                      return 1;
                    }
                    if (size < uVar7 * 2 + local_68) {
                      return 1;
                    }
                    local_58->lut_size = uVar7;
                    local_48 = uVar8;
                    pfVar4 = (float *)malloc(uVar7 * 4);
                    local_58->lut = pfVar4;
                    for (uVar6 = 0; uVar8 = local_48, local_68 = pos_00, uVar7 != uVar6;
                        uVar6 = uVar6 + 1) {
                      fVar11 = 0.0;
                      if (pos_00 + 2 <= size) {
                        fVar11 = (float)(ushort)(*(ushort *)(data + pos_00) << 8 |
                                                *(ushort *)(data + pos_00) >> 8) * 1.5259022e-05;
                      }
                      pfVar4[uVar6] = fVar11;
                      pos_00 = pos_00 + 2;
                    }
                  }
                }
                uVar3 = isICCword(data,size,pos_00,"para");
                if (uVar3 != 0) {
                  icc->has_trc = 1;
                  if (size < pos_00 + 10) {
                    uVar3 = 0;
                  }
                  else {
                    uVar2 = *(ushort *)(data + pos_00 + 8) << 8 |
                            *(ushort *)(data + pos_00 + 8) >> 8;
                    if (4 < uVar2) {
                      return 1;
                    }
                    uVar3 = (uint)uVar2;
                  }
                  local_68 = pos_00 + 0xc;
                  pLVar10 = local_50 + uVar8;
                  pLVar10->type = uVar3 + 2;
                  fVar11 = decodeICC15Fixed16(data,size,&local_68);
                  pLVar10->gamma = fVar11;
                  if (uVar3 != 0) {
                    fVar11 = decodeICC15Fixed16(data,size,&local_68);
                    pLVar10->a = fVar11;
                    fVar11 = decodeICC15Fixed16(data,size,&local_68);
                    pLVar10->b = fVar11;
                    if (uVar3 != 1) {
                      fVar11 = decodeICC15Fixed16(data,size,&local_68);
                      pLVar10->c = fVar11;
                      if (2 < uVar3) {
                        fVar11 = decodeICC15Fixed16(data,size,&local_68);
                        pLVar10->d = fVar11;
                        if (uVar3 == 4) {
                          fVar11 = decodeICC15Fixed16(data,size,&local_68);
                          pLVar10->e = fVar11;
                          fVar11 = decodeICC15Fixed16(data,size,&local_68);
                          pLVar10->f = fVar11;
                        }
                      }
                    }
                  }
                }
              }
            }
            else {
              local_68 = pos_00 + 8;
              for (lVar9 = 0; lVar9 != 9; lVar9 = lVar9 + 1) {
                fVar11 = decodeICC15Fixed16(data,size,&local_68);
                icc->chad[lVar9] = fVar11;
              }
              icc->has_chad = 1;
            }
            goto LAB_00119cc2;
          }
          local_68 = pos_00 + 8;
          fVar11 = decodeICC15Fixed16(data,size,&local_68);
          icc->blue[0] = fVar11;
          fVar11 = decodeICC15Fixed16(data,size,&local_68);
          icc->blue[1] = fVar11;
          fVar11 = decodeICC15Fixed16(data,size,&local_68);
          icc->blue[2] = fVar11;
        }
        else {
          local_68 = pos_00 + 8;
          fVar11 = decodeICC15Fixed16(data,size,&local_68);
          icc->green[0] = fVar11;
          fVar11 = decodeICC15Fixed16(data,size,&local_68);
          icc->green[1] = fVar11;
          fVar11 = decodeICC15Fixed16(data,size,&local_68);
          icc->green[2] = fVar11;
        }
      }
      else {
        local_68 = pos_00 + 8;
        fVar11 = decodeICC15Fixed16(data,size,&local_68);
        icc->red[0] = fVar11;
        fVar11 = decodeICC15Fixed16(data,size,&local_68);
        icc->red[1] = fVar11;
        fVar11 = decodeICC15Fixed16(data,size,&local_68);
        icc->red[2] = fVar11;
      }
      icc->has_chromaticity = 1;
    }
    else {
      local_68 = pos_00 + 8;
      fVar11 = decodeICC15Fixed16(data,size,&local_68);
      icc->white[0] = fVar11;
      fVar11 = decodeICC15Fixed16(data,size,&local_68);
      icc->white[1] = fVar11;
      fVar11 = decodeICC15Fixed16(data,size,&local_68);
      icc->white[2] = fVar11;
      icc->has_whitepoint = 1;
    }
LAB_00119cc2:
    local_38 = local_38 + 1;
    pos = sVar1;
    if (size < local_68) {
      return 1;
    }
  } while( true );
}

Assistant:

static unsigned parseICC(LodePNGICC* icc, const unsigned char* data, size_t size) {
  size_t i, j;
  size_t pos = 0;
  unsigned version;
  unsigned inputspace;
  size_t numtags;

  if(size < 132) return 1; /* Too small to be a valid icc profile. */

  icc->has_chromaticity = 0;
  icc->has_whitepoint = 0;
  icc->has_trc = 0;
  icc->has_chad = 0;

  icc->trc[0].type = icc->trc[1].type = icc->trc[2].type = 0;
  icc->white[0] = icc->white[1] = icc->white[2] = 0;
  icc->red[0] = icc->red[1] = icc->red[2] = 0;
  icc->green[0] = icc->green[1] = icc->green[2] = 0;
  icc->blue[0] = icc->blue[1] = icc->blue[2] = 0;

  pos = 8;
  version = decodeICCUint32(data, size, &pos);
  if(pos >= size) return 1;
  icc->version_major = (int)((version >> 24) & 255);
  icc->version_minor = (int)((version >> 20) & 15);
  icc->version_bugfix = (int)((version >> 16) & 15);

  pos = 16;
  inputspace = decodeICCUint32(data, size, &pos);
  if(pos >= size) return 1;
  if(inputspace == 0x47524159) {
    /* The string  "GRAY" as unsigned 32-bit int. */
    icc->inputspace = 1;
  } else if(inputspace == 0x52474220) {
    /* The string  "RGB " as unsigned 32-bit int. */
    icc->inputspace = 2;
  } else {
    /* unsupported by PNG (CMYK, YCbCr, Lab, HSV, ...) */
    icc->inputspace = 0;
  }

  /* Should always be 0.9642, 1.0, 0.8249 */
  pos = 68;
  icc->illuminant[0] = decodeICC15Fixed16(data, size, &pos);
  icc->illuminant[1] = decodeICC15Fixed16(data, size, &pos);
  icc->illuminant[2] = decodeICC15Fixed16(data, size, &pos);

  pos = 128;
  numtags = decodeICCUint32(data, size, &pos);
  if(pos >= size) return 1;
  /* scan for tags we want to handle */
  for(i = 0; i < numtags; i++) {
    size_t offset;
    unsigned tagsize;
    size_t namepos = pos;
    pos += 4;
    offset = decodeICCUint32(data, size, &pos);
    tagsize = decodeICCUint32(data, size, &pos);
    if(pos >= size || offset >= size) return 1;
    if(offset + tagsize > size) return 1;
    if(tagsize < 8) return 1;

    if(isICCword(data, size, namepos, "wtpt")) {
      offset += 8; /* skip tag and reserved */
      icc->white[0] = decodeICC15Fixed16(data, size, &offset);
      icc->white[1] = decodeICC15Fixed16(data, size, &offset);
      icc->white[2] = decodeICC15Fixed16(data, size, &offset);
      icc->has_whitepoint = 1;
    } else if(isICCword(data, size, namepos, "rXYZ")) {
      offset += 8; /* skip tag and reserved */
      icc->red[0] = decodeICC15Fixed16(data, size, &offset);
      icc->red[1] = decodeICC15Fixed16(data, size, &offset);
      icc->red[2] = decodeICC15Fixed16(data, size, &offset);
      icc->has_chromaticity = 1;
    } else if(isICCword(data, size, namepos, "gXYZ")) {
      offset += 8; /* skip tag and reserved */
      icc->green[0] = decodeICC15Fixed16(data, size, &offset);
      icc->green[1] = decodeICC15Fixed16(data, size, &offset);
      icc->green[2] = decodeICC15Fixed16(data, size, &offset);
      icc->has_chromaticity = 1;
    } else if(isICCword(data, size, namepos, "bXYZ")) {
      offset += 8; /* skip tag and reserved */
      icc->blue[0] = decodeICC15Fixed16(data, size, &offset);
      icc->blue[1] = decodeICC15Fixed16(data, size, &offset);
      icc->blue[2] = decodeICC15Fixed16(data, size, &offset);
      icc->has_chromaticity = 1;
    } else if(isICCword(data, size, namepos, "chad")) {
      offset += 8; /* skip datatype keyword "sf32" and reserved */
      for(j = 0; j < 9; j++) {
        icc->chad[j] = decodeICC15Fixed16(data, size, &offset);
      }
      icc->has_chad = 1;
    } else if(isICCword(data, size, namepos, "rTRC") ||
              isICCword(data, size, namepos, "gTRC") ||
              isICCword(data, size, namepos, "bTRC") ||
              isICCword(data, size, namepos, "kTRC")) {
      char c = (char)data[namepos];
      /* both 'k' and 'r' are stored in channel 0 */
      int channel = (c == 'b') ? 2 : (c == 'g' ? 1 : 0);
      /* "curv": linear, gamma power or LUT */
      if(isICCword(data, size, offset, "curv")) {
        size_t count;
        LodePNGICCCurve* trc = &icc->trc[channel];
        icc->has_trc = 1;
        offset += 8; /* skip tag "curv" and reserved */
        count = decodeICCUint32(data, size, &offset);
        if(count == 0) {
          trc->type = 0; /* linear */
        } else if(count == 1) {
          trc->type = 2; /* gamma */
          trc->gamma = decodeICCUint16(data, size, &offset) / 256.0f;
        } else {
          trc->type = 1; /* LUT */
          if(offset + count * 2 > size || count > 16777216) return 1; /* also avoid crazy count */
          trc->lut_size = count;
          trc->lut = (float*)lodepng_malloc(count * sizeof(float));
          for(j = 0; j < count; j++) {
            trc->lut[j] = decodeICCUint16(data, size, &offset) * (1.0f / 65535.0f);
          }
        }
      }
      /* "para": parametric formula with gamma power, multipliers, biases and comparison point */
      /* TODO: test this on a realistic sample */
      if(isICCword(data, size, offset, "para")) {
        unsigned type;
        LodePNGICCCurve* trc = &icc->trc[channel];
        icc->has_trc = 1;
        offset += 8; /* skip tag "para" and reserved */
        type = decodeICCUint16(data, size, &offset);
        offset += 2;
        if(type > 4) return 1; /* unknown parametric curve type */
        trc->type = type + 2;
        trc->gamma = decodeICC15Fixed16(data, size, &offset);
        if(type >= 1) {
          trc->a = decodeICC15Fixed16(data, size, &offset);
          trc->b = decodeICC15Fixed16(data, size, &offset);
        }
        if(type >= 2) {
          trc->c = decodeICC15Fixed16(data, size, &offset);
        }
        if(type >= 3) {
          trc->d = decodeICC15Fixed16(data, size, &offset);
        }
        if(type == 4) {
          trc->e = decodeICC15Fixed16(data, size, &offset);
          trc->f = decodeICC15Fixed16(data, size, &offset);
        }
      }
      /* TODO: verify: does the "chrm" tag participate in computation so should be parsed? */
    }
    /* Return error if any parse went beyond the filesize. Note that the
    parsing itself was always safe since it bound-checks inside. */
    if(offset > size) return 1;
  }

  return 0;
}